

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IRContext::KillInstructionIf
          (IRContext *this,inst_iterator *begin,inst_iterator *end,
          function<bool_(spvtools::opt::Instruction_*)> *condition)

{
  bool bVar1;
  Instruction *pIVar2;
  Instruction *instruction;
  inst_iterator it;
  bool removed;
  function<bool_(spvtools::opt::Instruction_*)> *condition_local;
  inst_iterator *end_local;
  inst_iterator *begin_local;
  IRContext *this_local;
  
  it.super_iterator.node_._7_1_ = 0;
  InstructionList::iterator::iterator((iterator *)&instruction,begin);
  while( true ) {
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)&instruction,
                              &end->super_iterator);
    if (!bVar1) break;
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)&instruction);
    bVar1 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()(condition,pIVar2);
    if (bVar1) {
      it.super_iterator.node_._7_1_ = 1;
      pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&instruction);
      InstructionList::iterator::operator++((iterator *)&instruction);
      KillInst(this,pIVar2);
    }
    else {
      InstructionList::iterator::operator++((iterator *)&instruction);
    }
  }
  return (bool)(it.super_iterator.node_._7_1_ & 1);
}

Assistant:

bool IRContext::KillInstructionIf(Module::inst_iterator begin,
                                  Module::inst_iterator end,
                                  std::function<bool(Instruction*)> condition) {
  bool removed = false;
  for (auto it = begin; it != end;) {
    if (!condition(&*it)) {
      ++it;
      continue;
    }

    removed = true;
    // `it` is an iterator on an intrusive list. Next is invalidated on the
    // current node when an instruction is killed. The iterator must be moved
    // forward before deleting the node.
    auto instruction = &*it;
    ++it;
    KillInst(instruction);
  }

  return removed;
}